

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcInfoTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::RenderTargetInfoCase::iterate(RenderTargetInfoCase *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  allocator<char> local_851;
  string local_850;
  allocator<char> local_829;
  string local_828;
  allocator<char> local_801;
  string local_800;
  LogNumber<long> local_7e0;
  allocator<char> local_769;
  string local_768;
  allocator<char> local_741;
  string local_740;
  allocator<char> local_719;
  string local_718;
  LogNumber<long> local_6f8;
  allocator<char> local_681;
  string local_680;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  LogNumber<long> local_610;
  allocator<char> local_599;
  string local_598;
  allocator<char> local_571;
  string local_570;
  allocator<char> local_549;
  string local_548;
  LogNumber<long> local_528;
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  LogNumber<long> local_440;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  LogNumber<long> local_358;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  LogNumber<long> local_270;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  LogNumber<long> local_188;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_b1;
  string local_b0;
  LogNumber<long> local_90;
  PixelFormat *local_20;
  PixelFormat *pixelFormat;
  RenderTarget *renderTarget;
  RenderTargetInfoCase *this_local;
  
  renderTarget = (RenderTarget *)this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[4])();
  pixelFormat = (PixelFormat *)CONCAT44(extraout_var,iVar1);
  local_20 = tcu::RenderTarget::getPixelFormat((RenderTarget *)pixelFormat);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Width",&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Width",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"px",&local_111);
  iVar1 = tcu::RenderTarget::getWidth((RenderTarget *)pixelFormat);
  tcu::LogNumber<long>::LogNumber
            (&local_90,&local_b0,&local_e8,&local_110,QP_KEY_TAG_NONE,(long)iVar1);
  pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"Height",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"Height",&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"px",&local_1f9);
  iVar1 = tcu::RenderTarget::getHeight((RenderTarget *)pixelFormat);
  tcu::LogNumber<long>::LogNumber
            (&local_188,&local_1a8,&local_1d0,&local_1f8,QP_KEY_TAG_NONE,(long)iVar1);
  pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"RedBits",&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"Red bits",&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"",&local_2e1);
  tcu::LogNumber<long>::LogNumber
            (&local_270,&local_290,&local_2b8,&local_2e0,QP_KEY_TAG_NONE,(long)local_20->redBits);
  pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"GreenBits",&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"Green bits",&local_3a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"",&local_3c9);
  tcu::LogNumber<long>::LogNumber
            (&local_358,&local_378,&local_3a0,&local_3c8,QP_KEY_TAG_NONE,(long)local_20->greenBits);
  pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"BlueBits",&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"Blue bits",&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"",&local_4b1);
  tcu::LogNumber<long>::LogNumber
            (&local_440,&local_460,&local_488,&local_4b0,QP_KEY_TAG_NONE,(long)local_20->blueBits);
  pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_440);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"AlphaBits",&local_549);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"Alpha bits",&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"",&local_599);
  tcu::LogNumber<long>::LogNumber
            (&local_528,&local_548,&local_570,&local_598,QP_KEY_TAG_NONE,(long)local_20->alphaBits);
  pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_528);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,"DepthBits",&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"Depth bits",&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"",&local_681);
  iVar1 = tcu::RenderTarget::getDepthBits((RenderTarget *)pixelFormat);
  tcu::LogNumber<long>::LogNumber
            (&local_610,&local_630,&local_658,&local_680,QP_KEY_TAG_NONE,(long)iVar1);
  pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_610);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,"StencilBits",&local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_740,"Stencil bits",&local_741)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"",&local_769);
  iVar1 = tcu::RenderTarget::getStencilBits((RenderTarget *)pixelFormat);
  tcu::LogNumber<long>::LogNumber
            (&local_6f8,&local_718,&local_740,&local_768,QP_KEY_TAG_NONE,(long)iVar1);
  pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_800,"SampleCount",&local_801);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_828,"Sample count",&local_829)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_850,"",&local_851);
  iVar1 = tcu::RenderTarget::getNumSamples((RenderTarget *)pixelFormat);
  tcu::LogNumber<long>::LogNumber
            (&local_7e0,&local_800,&local_828,&local_850,QP_KEY_TAG_NONE,(long)iVar1);
  tcu::TestLog::operator<<(pTVar3,&local_7e0);
  tcu::LogNumber<long>::~LogNumber(&local_7e0);
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator(&local_851);
  std::__cxx11::string::~string((string *)&local_828);
  std::allocator<char>::~allocator(&local_829);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator(&local_801);
  tcu::LogNumber<long>::~LogNumber(&local_6f8);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  std::__cxx11::string::~string((string *)&local_740);
  std::allocator<char>::~allocator(&local_741);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator(&local_719);
  tcu::LogNumber<long>::~LogNumber(&local_610);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  tcu::LogNumber<long>::~LogNumber(&local_528);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator(&local_599);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  tcu::LogNumber<long>::~LogNumber(&local_440);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  tcu::LogNumber<long>::~LogNumber(&local_358);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  tcu::LogNumber<long>::~LogNumber(&local_270);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  tcu::LogNumber<long>::~LogNumber(&local_188);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  tcu::LogNumber<long>::~LogNumber(&local_90);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

IterateResult iterate(void)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();

		m_testCtx.getLog() << TestLog::Integer("Width", "Width", "px", QP_KEY_TAG_NONE, renderTarget.getWidth())
						   << TestLog::Integer("Height", "Height", "px", QP_KEY_TAG_NONE, renderTarget.getHeight())
						   << TestLog::Integer("RedBits", "Red bits", "", QP_KEY_TAG_NONE, pixelFormat.redBits)
						   << TestLog::Integer("GreenBits", "Green bits", "", QP_KEY_TAG_NONE, pixelFormat.greenBits)
						   << TestLog::Integer("BlueBits", "Blue bits", "", QP_KEY_TAG_NONE, pixelFormat.blueBits)
						   << TestLog::Integer("AlphaBits", "Alpha bits", "", QP_KEY_TAG_NONE, pixelFormat.alphaBits)
						   << TestLog::Integer("DepthBits", "Depth bits", "", QP_KEY_TAG_NONE,
											   renderTarget.getDepthBits())
						   << TestLog::Integer("StencilBits", "Stencil bits", "", QP_KEY_TAG_NONE,
											   renderTarget.getStencilBits())
						   << TestLog::Integer("SampleCount", "Sample count", "", QP_KEY_TAG_NONE,
											   renderTarget.getNumSamples());

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}